

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

bfile_t * bf_create_w(char *filename)

{
  FILE *pFVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDI;
  bfile_t *bfile;
  FILE *file;
  bfile_t *local_18;
  
  local_18 = (bfile_t *)0x0;
  pFVar1 = fopen(in_RDI,"wb");
  if (pFVar1 != (FILE *)0x0) {
    local_18 = create_bfile_t((uint32_t)((ulong)pFVar1 >> 0x20));
    local_18->file = (FILE *)pFVar1;
    sVar2 = strlen(in_RDI);
    pcVar3 = (char *)malloc(sVar2 + 1);
    local_18->filename = pcVar3;
    strcpy(local_18->filename,in_RDI);
    local_18->flags = local_18->flags | 0x200;
  }
  return local_18;
}

Assistant:

bfile_t *
bf_create_w(
    const char * filename )
{
    FILE * file;
    bfile_t * bfile;

    bfile = NULL;
    file = fopen( filename, "wb" );
    if ( file != NULL ) {
        bfile = create_bfile_t( BFILE_BLOCK_SIZE );
        bfile->file = file;
        bfile->filename = (char *)malloc( strlen( filename ) + 1 );
        assert( bfile->filename );
        strcpy( bfile->filename, filename );
        bfile->flags |= BF_WRITABLE;
    }

    return bfile;
}